

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O1

void __thiscall
capnp::PackedFdMessageReader::PackedFdMessageReader
          (PackedFdMessageReader *this,int fd,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  ReaderOptions options_00;
  
  (this->super_FdInputStream).fd = fd;
  (this->super_FdInputStream).autoclose.fd = -1;
  (this->super_FdInputStream).super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__PackedFdMessageReader_0038a8f8;
  (this->super_BufferedInputStreamWrapper).super_BufferedInputStream.super_InputStream.
  _vptr_InputStream = (_func_int **)&DAT_0038a928;
  (this->super_PackedMessageReader).super_PackedInputStream.super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__PackedFdMessageReader_0038a960;
  (this->super_PackedMessageReader).super_InputStreamMessageReader.super_MessageReader.
  _vptr_MessageReader = (_func_int **)&PTR__PackedFdMessageReader_0038a990;
  kj::BufferedInputStreamWrapper::BufferedInputStreamWrapper
            (&this->super_BufferedInputStreamWrapper,(InputStream *)this,
             (ArrayPtr<unsigned_char>)ZEXT816(0));
  (this->super_FdInputStream).super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__PackedFdMessageReader_0038a8f8;
  (this->super_BufferedInputStreamWrapper).super_BufferedInputStream.super_InputStream.
  _vptr_InputStream = (_func_int **)&DAT_0038a928;
  (this->super_PackedMessageReader).super_PackedInputStream.super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__PackedFdMessageReader_0038a960;
  (this->super_PackedMessageReader).super_InputStreamMessageReader.super_MessageReader.
  _vptr_MessageReader = (_func_int **)&PTR__PackedFdMessageReader_0038a990;
  options_00._12_4_ = 0;
  options_00.traversalLimitInWords = SUB128(options._0_12_,0);
  options_00.nestingLimit = SUB124(options._0_12_,8);
  PackedMessageReader::PackedMessageReader
            (&this->super_PackedMessageReader,
             &(this->super_BufferedInputStreamWrapper).super_BufferedInputStream,options_00,
             scratchSpace);
  (this->super_FdInputStream).super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__PackedFdMessageReader_0038a8f8;
  (this->super_BufferedInputStreamWrapper).super_BufferedInputStream.super_InputStream.
  _vptr_InputStream = (_func_int **)&DAT_0038a928;
  (this->super_PackedMessageReader).super_PackedInputStream.super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__PackedFdMessageReader_0038a960;
  (this->super_PackedMessageReader).super_InputStreamMessageReader.super_MessageReader.
  _vptr_MessageReader = (_func_int **)&PTR__PackedFdMessageReader_0038a990;
  return;
}

Assistant:

PackedFdMessageReader::PackedFdMessageReader(
    int fd, ReaderOptions options, kj::ArrayPtr<word> scratchSpace)
    : FdInputStream(fd),
      BufferedInputStreamWrapper(static_cast<FdInputStream&>(*this)),
      PackedMessageReader(static_cast<BufferedInputStreamWrapper&>(*this),
                          options, scratchSpace) {}